

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LNode.h
# Opt level: O1

void __thiscall
LNodeData<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
~LNodeData(LNodeData<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_LNode)._vptr_LNode = (_func_int **)&PTR__LNodeData_00122d80;
  pcVar2 = (this->value)._M_dataplus._M_p;
  paVar1 = &(this->value).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  operator_delete(this,0x30);
  return;
}

Assistant:

~LNodeData() override = default;